

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O0

GCproto * lj_bcread_proto(LexState *ls)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  byte bVar4;
  uint8_t *puVar5;
  byte *pbVar6;
  uint32_t sizekgc_00;
  uint32_t sizekn_00;
  uint32_t uVar7;
  MSize sizebc_00;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  GCproto *pt_00;
  void *pvVar11;
  sbyte local_dc;
  uint32_t local_d0;
  MSize sizeli;
  BCLine numline;
  BCLine firstline;
  MSize sizedbg;
  MSize ofsdbg;
  MSize ofsuv;
  MSize ofsk;
  MSize sizept;
  MSize sizebc;
  MSize sizekn;
  MSize sizekgc;
  MSize sizeuv;
  MSize flags;
  MSize numparams;
  MSize framesize;
  GCproto *pt;
  LexState *ls_local;
  uint32_t v_5;
  uint32_t v_4;
  uint32_t v_3;
  uint32_t v_2;
  uint32_t v_1;
  uint32_t v;
  
  numline = 0;
  sizeli = 0;
  local_d0 = 0;
  puVar5 = (uint8_t *)ls->p;
  ls->p = (char *)(puVar5 + 1);
  uVar1 = *puVar5;
  puVar5 = (uint8_t *)ls->p;
  ls->p = (char *)(puVar5 + 1);
  uVar2 = *puVar5;
  puVar5 = (uint8_t *)ls->p;
  ls->p = (char *)(puVar5 + 1);
  uVar3 = *puVar5;
  pbVar6 = (byte *)ls->p;
  ls->p = (char *)(pbVar6 + 1);
  bVar4 = *pbVar6;
  sizekgc_00 = lj_buf_ruleb128(&ls->p);
  sizekn_00 = lj_buf_ruleb128(&ls->p);
  uVar7 = lj_buf_ruleb128(&ls->p);
  sizebc_00 = uVar7 + 1;
  if (((ls->level & 2) == 0) && (numline = lj_buf_ruleb128(&ls->p), numline != 0)) {
    sizeli = lj_buf_ruleb128(&ls->p);
    local_d0 = lj_buf_ruleb128(&ls->p);
  }
  uVar8 = sizebc_00 * 4 + sizekgc_00 * 8 + 0x6f & 0xfffffff8;
  uVar9 = sizekn_00 * 8 + uVar8;
  uVar10 = (bVar4 + 1 & 0xfffffffe) * 2 + uVar9;
  pt_00 = (GCproto *)lj_mem_newgco(ls->L,(ulong)(numline + uVar10));
  pt_00->gct = '\a';
  pt_00->numparams = uVar2;
  pt_00->framesize = uVar3;
  pt_00->sizebc = sizebc_00;
  (pt_00->k).ptr64 = (long)&(pt_00->nextgc).gcptr64 + (ulong)uVar8;
  (pt_00->uv).ptr64 = (long)&(pt_00->nextgc).gcptr64 + (ulong)uVar9;
  pt_00->sizekgc = 0;
  pt_00->sizekn = sizekn_00;
  pt_00->sizept = numline + uVar10;
  pt_00->sizeuv = bVar4;
  pt_00->flags = uVar1;
  pt_00->trace = 0;
  (pt_00->chunkname).gcptr64 = (uint64_t)ls->chunkname;
  *(undefined4 *)((long)pt_00 + (ulong)(sizekgc_00 + 1) * -8 + (ulong)uVar8) = 0;
  bcread_bytecode(ls,pt_00,sizebc_00);
  bcread_uv(ls,pt_00,(uint)bVar4);
  bcread_kgc(ls,pt_00,sizekgc_00);
  pt_00->sizekgc = sizekgc_00;
  bcread_knum(ls,pt_00,sizekn_00);
  pt_00->firstline = sizeli;
  pt_00->numline = local_d0;
  if (numline == 0) {
    (pt_00->lineinfo).ptr64 = 0;
    (pt_00->uvinfo).ptr64 = 0;
    (pt_00->varinfo).ptr64 = 0;
  }
  else {
    if ((int)local_d0 < 0x100) {
      local_dc = 0;
    }
    else {
      local_dc = 2;
      if ((int)local_d0 < 0x10000) {
        local_dc = 1;
      }
    }
    (pt_00->lineinfo).ptr64 = (long)&(pt_00->nextgc).gcptr64 + (ulong)uVar10;
    (pt_00->uvinfo).ptr64 =
         (long)&(pt_00->nextgc).gcptr64 + (ulong)(uVar7 << local_dc) + (ulong)uVar10;
    bcread_dbg(ls,pt_00,numline);
    pvVar11 = bcread_varinfo(pt_00);
    (pt_00->varinfo).ptr64 = (uint64_t)pvVar11;
  }
  return pt_00;
}

Assistant:

GCproto *lj_bcread_proto(LexState *ls)
{
  GCproto *pt;
  MSize framesize, numparams, flags, sizeuv, sizekgc, sizekn, sizebc, sizept;
  MSize ofsk, ofsuv, ofsdbg;
  MSize sizedbg = 0;
  BCLine firstline = 0, numline = 0;

  /* Read prototype header. */
  flags = bcread_byte(ls);
  numparams = bcread_byte(ls);
  framesize = bcread_byte(ls);
  sizeuv = bcread_byte(ls);
  sizekgc = bcread_uleb128(ls);
  sizekn = bcread_uleb128(ls);
  sizebc = bcread_uleb128(ls) + 1;
  if (!(bcread_flags(ls) & BCDUMP_F_STRIP)) {
    sizedbg = bcread_uleb128(ls);
    if (sizedbg) {
      firstline = bcread_uleb128(ls);
      numline = bcread_uleb128(ls);
    }
  }

  /* Calculate total size of prototype including all colocated arrays. */
  sizept = (MSize)sizeof(GCproto) +
	   sizebc*(MSize)sizeof(BCIns) +
	   sizekgc*(MSize)sizeof(GCRef);
  sizept = (sizept + (MSize)sizeof(TValue)-1) & ~((MSize)sizeof(TValue)-1);
  ofsk = sizept; sizept += sizekn*(MSize)sizeof(TValue);
  ofsuv = sizept; sizept += ((sizeuv+1)&~1)*2;
  ofsdbg = sizept; sizept += sizedbg;

  /* Allocate prototype object and initialize its fields. */
  pt = (GCproto *)lj_mem_newgco(ls->L, (MSize)sizept);
  pt->gct = ~LJ_TPROTO;
  pt->numparams = (uint8_t)numparams;
  pt->framesize = (uint8_t)framesize;
  pt->sizebc = sizebc;
  setmref(pt->k, (char *)pt + ofsk);
  setmref(pt->uv, (char *)pt + ofsuv);
  pt->sizekgc = 0;  /* Set to zero until fully initialized. */
  pt->sizekn = sizekn;
  pt->sizept = sizept;
  pt->sizeuv = (uint8_t)sizeuv;
  pt->flags = (uint8_t)flags;
  pt->trace = 0;
  setgcref(pt->chunkname, obj2gco(ls->chunkname));

  /* Close potentially uninitialized gap between bc and kgc. */
  *(uint32_t *)((char *)pt + ofsk - sizeof(GCRef)*(sizekgc+1)) = 0;

  /* Read bytecode instructions and upvalue refs. */
  bcread_bytecode(ls, pt, sizebc);
  bcread_uv(ls, pt, sizeuv);

  /* Read constants. */
  bcread_kgc(ls, pt, sizekgc);
  pt->sizekgc = sizekgc;
  bcread_knum(ls, pt, sizekn);

  /* Read and initialize debug info. */
  pt->firstline = firstline;
  pt->numline = numline;
  if (sizedbg) {
    MSize sizeli = (sizebc-1) << (numline < 256 ? 0 : numline < 65536 ? 1 : 2);
    setmref(pt->lineinfo, (char *)pt + ofsdbg);
    setmref(pt->uvinfo, (char *)pt + ofsdbg + sizeli);
    bcread_dbg(ls, pt, sizedbg);
    setmref(pt->varinfo, bcread_varinfo(pt));
  } else {
    setmref(pt->lineinfo, NULL);
    setmref(pt->uvinfo, NULL);
    setmref(pt->varinfo, NULL);
  }
  return pt;
}